

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDEdge::MarkedFaceCount(ON_SubDEdge *this)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  ulong uVar5;
  ON_SubDFacePtr *pOVar6;
  
  uVar2 = this->m_face_count;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    pOVar6 = this->m_face2;
    uVar3 = 0;
    uVar4 = 0;
    do {
      if ((uVar4 == 2) && (pOVar6 = this->m_facex, pOVar6 == (ON_SubDFacePtr *)0x0)) {
        return uVar3;
      }
      uVar5 = pOVar6->m_ptr & 0xfffffffffffffff8;
      if (uVar5 != 0) {
        bVar1 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(uVar5 + 0x10));
        uVar3 = uVar3 + bVar1;
        uVar2 = this->m_face_count;
      }
      uVar4 = uVar4 + 1;
      pOVar6 = pOVar6 + 1;
    } while (uVar4 < uVar2);
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDEdge::MarkedFaceCount() const
{
  unsigned int mark_count = 0;
  const ON_SubDFacePtr* fptr = m_face2;
  for (unsigned short efi = 0; efi < m_face_count; ++efi, ++fptr)
  {
    if (2 == efi)
    {
      fptr = m_facex;
      if (nullptr == fptr)
        break;
    }
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr->m_ptr);
    if (nullptr != f && f->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}